

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O2

void __thiscall
dg::llvmdg::LazyLLVMCallGraph::processBBlock
          (LazyLLVMCallGraph *this,Function *parent,BasicBlock *B,
          SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> *queue)

{
  LLVMPointerAnalysis *pLVar1;
  LLVMPointsToSetImpl *pLVar2;
  SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> *this_00;
  char cVar3;
  bool bVar4;
  BasicBlock *pBVar5;
  undefined8 uVar6;
  BasicBlock *pBVar7;
  BasicBlock *CI;
  BasicBlock *pBVar8;
  undefined1 auVar9 [12];
  const_iterator __begin4;
  Function *F;
  const_iterator __end4;
  const_iterator local_78;
  LLVMPointsToSetImpl *local_70;
  LazyLLVMCallGraph *local_68;
  BasicBlock *local_60;
  SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> *local_58;
  GenericCallGraph<const_llvm::Function_*> *local_50;
  Function *local_48;
  const_iterator local_40;
  Function *local_38;
  
  pBVar8 = B + 0x30;
  pBVar7 = B + 0x28;
  local_50 = &this->_cg;
  local_68 = this;
  local_60 = pBVar7;
  local_58 = queue;
  local_38 = parent;
  while( true ) {
    pBVar8 = *(BasicBlock **)pBVar8;
    if (pBVar8 == pBVar7) break;
    pBVar5 = pBVar8 + -0x18;
    if (pBVar8 == (BasicBlock *)0x0) {
      pBVar5 = (BasicBlock *)0x0;
    }
    CI = pBVar5;
    if (pBVar5[0x10] != (BasicBlock)0x53) {
      CI = (BasicBlock *)0x0;
    }
    if (pBVar5[0x10] == (BasicBlock)0x53 && pBVar8 != (BasicBlock *)0x0) {
      pLVar1 = local_68->_pta;
      uVar6 = llvm::Value::stripPointerCasts();
      (**(code **)(*(long *)pLVar1 + 8))(&local_70,pLVar1,uVar6);
      pLVar2 = local_70;
      if (local_70 == (LLVMPointsToSetImpl *)0x0) {
        local_78.impl = (LLVMPointsToSetImpl *)0x0;
      }
      else {
        cVar3 = (**(code **)(*(long *)local_70 + 0x38))(local_70);
        local_78.impl = (LLVMPointsToSetImpl *)0x0;
        if (cVar3 == '\0') {
          local_78.impl = pLVar2;
        }
      }
      this_00 = local_58;
      local_40.impl = (LLVMPointsToSetImpl *)0x0;
      while (bVar4 = LLVMPointsToSet::const_iterator::operator!=(&local_78,&local_40), bVar4) {
        auVar9 = (**(code **)(*(long *)local_78.impl + 0x48))();
        local_48 = auVar9._0_8_;
        if (local_48[0x10] != (Function)0x0) {
          local_48 = (Function *)0x0;
        }
        if ((local_48 != (Function *)0x0) &&
           (bVar4 = anon_unknown_2::callIsCompatible(local_48,(CallInst *)CI,auVar9._8_4_), bVar4))
        {
          GenericCallGraph<const_llvm::Function_*>::addCall(local_50,&local_38,&local_48);
          ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_>::push(this_00,&local_48);
        }
        LLVMPointsToSet::const_iterator::operator++(&local_78);
      }
      pBVar7 = local_60;
      if (local_70 != (LLVMPointsToSetImpl *)0x0) {
        (**(code **)(*(long *)local_70 + 0x58))();
        pBVar7 = local_60;
      }
    }
    pBVar8 = pBVar8 + 8;
  }
  return;
}

Assistant:

void
    processBBlock(const llvm::Function *parent, const llvm::BasicBlock &B,
                  ADT::SetQueue<QueueFIFO<const llvm::Function *>> &queue) {
        assert(_pta && "This method can be used only with PTA");
        for (auto &I : B) {
            if (auto *C = llvm::dyn_cast<llvm::CallInst>(&I)) {
                auto pts = _pta->getLLVMPointsTo(_getCalledValue(C));
                for (const auto &ptr : pts) {
                    if (auto *F = llvm::dyn_cast<llvm::Function>(ptr.value)) {
                        if (callIsCompatible(F, C)) {
                            _cg.addCall(parent, F);
                            queue.push(F);
                        }
                    }
                }
            }
        }
    }